

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_add_mem_to_archive_file_in_place_v2
                  (char *pZip_filename,char *pArchive_name,void *pBuf,size_t buf_size,void *pComment
                  ,mz_uint16 comment_size,mz_uint level_and_flags,mz_zip_error *pErr)

{
  bool bVar1;
  mz_bool mVar2;
  int iVar3;
  int ignoredStatus;
  mz_zip_error actual_err;
  stat file_stat;
  mz_zip_archive zip_archive;
  mz_bool local_40;
  mz_bool created_new_archive;
  mz_bool status;
  mz_uint16 comment_size_local;
  void *pComment_local;
  size_t buf_size_local;
  void *pBuf_local;
  char *pArchive_name_local;
  char *pZip_filename_local;
  
  bVar1 = false;
  mz_zip_zero_struct((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
  if ((int)level_and_flags < 0) {
    level_and_flags = 6;
  }
  if ((((pZip_filename == (char *)0x0) || (pArchive_name == (char *)0x0)) ||
      ((buf_size != 0 && (pBuf == (void *)0x0)))) ||
     (((comment_size != 0 && (pComment == (void *)0x0)) || (10 < (level_and_flags & 0xf))))) {
    if (pErr != (mz_zip_error *)0x0) {
      *pErr = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_filename_local._4_4_ = 0;
  }
  else {
    mVar2 = mz_zip_writer_validate_archive_name(pArchive_name);
    if (mVar2 == 0) {
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = MZ_ZIP_INVALID_FILENAME;
      }
      pZip_filename_local._4_4_ = 0;
    }
    else {
      iVar3 = stat(pZip_filename,(stat *)&ignoredStatus);
      if (iVar3 == 0) {
        mVar2 = mz_zip_reader_init_file_v2
                          ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pZip_filename,
                           level_and_flags | 0x800,0,0);
        if (mVar2 == 0) {
          if (pErr != (mz_zip_error *)0x0) {
            *pErr = zip_archive.m_zip_mode;
          }
          return 0;
        }
        mVar2 = mz_zip_writer_init_from_reader_v2
                          ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pZip_filename,
                           level_and_flags);
        if (mVar2 == 0) {
          if (pErr != (mz_zip_error *)0x0) {
            *pErr = zip_archive.m_zip_mode;
          }
          mz_zip_reader_end_internal((mz_zip_archive *)(file_stat.__glibc_reserved + 2),0);
          return 0;
        }
      }
      else {
        mVar2 = mz_zip_writer_init_file_v2
                          ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pZip_filename,0,
                           level_and_flags);
        if (mVar2 == 0) {
          if (pErr != (mz_zip_error *)0x0) {
            *pErr = zip_archive.m_zip_mode;
          }
          return 0;
        }
        bVar1 = true;
      }
      local_40 = mz_zip_writer_add_mem_ex
                           ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pArchive_name,pBuf,
                            buf_size,pComment,comment_size,level_and_flags,0,0);
      mVar2 = mz_zip_writer_finalize_archive((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
      if (mVar2 == 0) {
        local_40 = 0;
      }
      mVar2 = mz_zip_writer_end_internal
                        ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),local_40);
      if (mVar2 == 0) {
        local_40 = 0;
      }
      if ((local_40 == 0) && (bVar1)) {
        remove(pZip_filename);
      }
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = zip_archive.m_zip_mode;
      }
      pZip_filename_local._4_4_ = local_40;
    }
  }
  return pZip_filename_local._4_4_;
}

Assistant:

mz_bool mz_zip_add_mem_to_archive_file_in_place_v2(
    const char *pZip_filename, const char *pArchive_name, const void *pBuf,
    size_t buf_size, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags, mz_zip_error *pErr) {
  mz_bool status, created_new_archive = MZ_FALSE;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_zip_error actual_err = MZ_ZIP_NO_ERROR;

  mz_zip_zero_struct(&zip_archive);
  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;

  if ((!pZip_filename) || (!pArchive_name) || ((buf_size) && (!pBuf)) ||
      ((comment_size) && (!pComment)) ||
      ((level_and_flags & 0xF) > MZ_UBER_COMPRESSION)) {
    if (pErr)
      *pErr = MZ_ZIP_INVALID_PARAMETER;
    return MZ_FALSE;
  }

  if (!mz_zip_writer_validate_archive_name(pArchive_name)) {
    if (pErr)
      *pErr = MZ_ZIP_INVALID_FILENAME;
    return MZ_FALSE;
  }

  /* Important: The regular non-64 bit version of stat() can fail here if the
   * file is very large, which could cause the archive to be overwritten. */
  /* So be sure to compile with _LARGEFILE64_SOURCE 1 */
  if (MZ_FILE_STAT(pZip_filename, &file_stat) != 0) {
    /* Create a new archive. */
    if (!mz_zip_writer_init_file_v2(&zip_archive, pZip_filename, 0,
                                    level_and_flags)) {
      if (pErr)
        *pErr = zip_archive.m_last_error;
      return MZ_FALSE;
    }

    created_new_archive = MZ_TRUE;
  } else {
    /* Append to an existing archive. */
    if (!mz_zip_reader_init_file_v2(
            &zip_archive, pZip_filename,
            level_and_flags | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY, 0,
            0)) {
      if (pErr)
        *pErr = zip_archive.m_last_error;
      return MZ_FALSE;
    }

    if (!mz_zip_writer_init_from_reader_v2(&zip_archive, pZip_filename,
                                           level_and_flags)) {
      if (pErr)
        *pErr = zip_archive.m_last_error;

      mz_zip_reader_end_internal(&zip_archive, MZ_FALSE);

      return MZ_FALSE;
    }
  }

  status =
      mz_zip_writer_add_mem_ex(&zip_archive, pArchive_name, pBuf, buf_size,
                               pComment, comment_size, level_and_flags, 0, 0);
  actual_err = zip_archive.m_last_error;

  /* Always finalize, even if adding failed for some reason, so we have a valid
   * central directory. (This may not always succeed, but we can try.) */
  if (!mz_zip_writer_finalize_archive(&zip_archive)) {
    if (!actual_err)
      actual_err = zip_archive.m_last_error;

    status = MZ_FALSE;
  }

  if (!mz_zip_writer_end_internal(&zip_archive, status)) {
    if (!actual_err)
      actual_err = zip_archive.m_last_error;

    status = MZ_FALSE;
  }

  if ((!status) && (created_new_archive)) {
    /* It's a new archive and something went wrong, so just delete it. */
    int ignoredStatus = MZ_DELETE_FILE(pZip_filename);
    (void)ignoredStatus;
  }

  if (pErr)
    *pErr = actual_err;

  return status;
}